

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

void __thiscall QSpanData::adjustSpanMethods(QSpanData *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Format FVar5;
  QClipData *pQVar6;
  AlphamapBlitFunc p_Var7;
  RectFillFunc p_Var8;
  code *pcVar9;
  int iVar10;
  undefined1 auVar11 [16];
  
  this->alphaRGBBlit = (AlphaRGBBlitFunc)0x0;
  this->fillRect = (RectFillFunc)0x0;
  this->bitmapBlit = (BitmapBlitFunc)0x0;
  this->alphamapBlit = (AlphamapBlitFunc)0x0;
  switch(this->field_0x88) {
  case 0:
    this->unclipped_blend = (ProcessSpans)0x0;
    goto LAB_003b8a63;
  case 1:
    FVar5 = this->rasterBuffer->format;
    pcVar9 = qDrawHelper[FVar5].blendColor;
    this->unclipped_blend = pcVar9;
    p_Var7 = qDrawHelper[FVar5].alphamapBlit;
    this->bitmapBlit = qDrawHelper[FVar5].bitmapBlit;
    this->alphamapBlit = p_Var7;
    p_Var8 = qDrawHelper[FVar5].fillRect;
    this->alphaRGBBlit = qDrawHelper[FVar5].alphaRGBBlit;
    this->fillRect = p_Var8;
    break;
  case 2:
  case 3:
  case 4:
    pcVar9 = qBlendGradient;
    this->unclipped_blend = qBlendGradient;
    goto LAB_003b8a48;
  case 5:
    pcVar9 = (code *)(this->field_23).texture.imageData;
    if (pcVar9 != (ProcessSpans)0x0) {
      pcVar9 = qBlendTexture;
    }
    this->unclipped_blend = pcVar9;
    break;
  default:
    pcVar9 = this->unclipped_blend;
  }
  if (pcVar9 == (ProcessSpans)0x0) {
LAB_003b8a63:
    pcVar9 = (ProcessSpans)0x0;
  }
  else {
LAB_003b8a48:
    pQVar6 = this->clip;
    if (pQVar6 != (QClipData *)0x0) {
      if ((pQVar6->field_0x48 & 2) == 0) {
        pcVar9 = qt_span_fill_clipped;
      }
      else {
        uVar1 = (pQVar6->clipRect).x1;
        uVar3 = (pQVar6->clipRect).y1;
        uVar2 = (pQVar6->clipRect).x2;
        uVar4 = (pQVar6->clipRect).y2;
        auVar11._0_4_ = -(uint)((int)uVar2 < (int)uVar1);
        auVar11._4_4_ = auVar11._0_4_;
        auVar11._8_4_ = -(uint)((int)uVar4 < (int)uVar3);
        auVar11._12_4_ = -(uint)((int)uVar4 < (int)uVar3);
        iVar10 = movmskpd((int)pQVar6,auVar11);
        pcVar9 = (ProcessSpans)0x0;
        if (iVar10 == 0) {
          pcVar9 = qt_span_fill_clipRect;
        }
      }
    }
  }
  this->blend = pcVar9;
  return;
}

Assistant:

void QSpanData::adjustSpanMethods()
{
    bitmapBlit = nullptr;
    alphamapBlit = nullptr;
    alphaRGBBlit = nullptr;

    fillRect = nullptr;

    switch(type) {
    case None:
        unclipped_blend = nullptr;
        break;
    case Solid: {
        const DrawHelper &drawHelper = qDrawHelper[rasterBuffer->format];
        unclipped_blend = drawHelper.blendColor;
        bitmapBlit = drawHelper.bitmapBlit;
        alphamapBlit = drawHelper.alphamapBlit;
        alphaRGBBlit = drawHelper.alphaRGBBlit;
        fillRect = drawHelper.fillRect;
        break;
    }
    case LinearGradient:
    case RadialGradient:
    case ConicalGradient:
        unclipped_blend = qBlendGradient;
        break;
    case Texture:
        unclipped_blend = qBlendTexture;
        if (!texture.imageData)
            unclipped_blend = nullptr;

        break;
    }
    // setup clipping
    if (!unclipped_blend) {
        blend = nullptr;
    } else if (!clip) {
        blend = unclipped_blend;
    } else if (clip->hasRectClip) {
        blend = clip->clipRect.isEmpty() ? nullptr : qt_span_fill_clipRect;
    } else {
        blend = qt_span_fill_clipped;
    }
}